

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstackedwidget.cpp
# Opt level: O2

void __thiscall QStackedWidget::setCurrentWidget(QStackedWidget *this,QWidget *widget)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  char local_38 [24];
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QFrame).super_QWidget.field_0x8;
  iVar2 = (**(code **)(**(long **)(lVar1 + 0x278) + 0xb8))();
  if (iVar2 == -1) {
    local_38[0] = '\x02';
    local_38[1] = '\0';
    local_38[2] = '\0';
    local_38[3] = '\0';
    local_38[0x14] = '\0';
    local_38[0x15] = '\0';
    local_38[0x16] = '\0';
    local_38[0x17] = '\0';
    local_38[4] = '\0';
    local_38[5] = '\0';
    local_38[6] = '\0';
    local_38[7] = '\0';
    local_38[8] = '\0';
    local_38[9] = '\0';
    local_38[10] = '\0';
    local_38[0xb] = '\0';
    local_38[0xc] = '\0';
    local_38[0xd] = '\0';
    local_38[0xe] = '\0';
    local_38[0xf] = '\0';
    local_38[0x10] = '\0';
    local_38[0x11] = '\0';
    local_38[0x12] = '\0';
    local_38[0x13] = '\0';
    local_20 = "default";
    QMessageLogger::warning
              (local_38,"QStackedWidget::setCurrentWidget: widget %p not contained in stack",widget)
    ;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    QStackedLayout::setCurrentWidget(*(QStackedLayout **)(lVar1 + 0x278),widget);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStackedWidget::setCurrentWidget(QWidget *widget)
{
    Q_D(QStackedWidget);
    if (Q_UNLIKELY(d->layout->indexOf(widget) == -1)) {
        qWarning("QStackedWidget::setCurrentWidget: widget %p not contained in stack", widget);
        return;
    }
    d->layout->setCurrentWidget(widget);
}